

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void do_command(string *cmd_string,bool suppress)

{
  char cVar1;
  int **ppiVar2;
  bool ***pppbVar3;
  bool **ppbVar4;
  int **arr;
  int **arr_00;
  int iVar5;
  int iVar6;
  bool bVar7;
  _Setfill<char> _Var8;
  byte bVar9;
  _Ios_Openmode _Var10;
  _Setw _Var11;
  int iVar12;
  undefined1 *puVar13;
  size_type sVar14;
  reference pvVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  long *plVar22;
  reference m_00;
  istream *piVar23;
  reference pcVar24;
  void *pvVar25;
  ostream *poVar26;
  byte local_d81;
  undefined1 local_ac8 [31];
  char c_5;
  iterator __end16;
  iterator __begin16;
  string *__range16;
  string local_a90 [4];
  int r_hash;
  string s_1;
  char *c_4;
  iterator __end14;
  iterator __begin14;
  string *__range14;
  string w;
  string local_a30 [8];
  string cm;
  _WordT local_a10;
  fstream fs;
  string local_800 [8];
  string name;
  Move *m_1;
  iterator __end11;
  iterator __begin11;
  vector<Move,_std::allocator<Move>_> *__range11;
  stringstream local_798 [8];
  stringstream ss_6;
  ostream local_788 [383];
  byte local_609;
  int local_608;
  int iStack_604;
  bool use_heuristics;
  int s;
  int n;
  string st;
  int local_5e0;
  int local_5dc;
  int i_6;
  char *pos_1;
  reference pcStack_5c8;
  int i_5;
  char *c_3;
  iterator __end13;
  iterator __begin13;
  string *__range13;
  string local_5a0 [4];
  int i_4;
  string ss_5;
  int local_57c;
  char *local_578;
  char *pos;
  char *c_2;
  iterator __end9;
  iterator __begin9;
  string *__range9;
  string ss_4;
  string local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510 [32];
  string local_4f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0 [32];
  string local_4b0 [8];
  string ss_3;
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  int local_418;
  allocator local_411;
  int i_3;
  allocator local_3e9;
  string local_3e8 [39];
  char local_3c1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_3c0;
  char cc;
  iterator __end7;
  iterator __begin7;
  string *__range7;
  string ss_2;
  int local_384;
  int local_380;
  int j_2;
  int i_2;
  bool leg;
  Move m;
  char *c_1;
  iterator __end5;
  iterator __begin5;
  string *__range5;
  string acr_1;
  string local_2d8 [8];
  string ss_1;
  int local_2b4;
  int local_2b0;
  int p_1;
  int j_1;
  int i_1;
  reference local_248;
  char *c;
  iterator __end4;
  iterator __begin4;
  string *__range4;
  string acr;
  string local_208 [8];
  string ss;
  int local_1e8;
  int local_1e4;
  int p;
  int j;
  int i;
  bool override;
  Move *mm;
  string local_1c0 [8];
  string command;
  _WordT local_1a0;
  stringstream line;
  bool suppress_local;
  string *cmd_string_local;
  
  _Var10 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0,(string *)cmd_string,_Var10);
  std::__cxx11::string::string(local_1c0);
  std::operator>>((istream *)&local_1a0,local_1c0);
  bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c0,"game");
  if (bVar7) {
    game_loop();
  }
  else {
    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1c0,"pb");
    if (bVar7) {
      find_moves();
      bVar7 = std::vector<Move,_std::allocator<Move>_>::empty(&moves);
      if (bVar7) {
        if (!suppress) {
          poVar26 = std::operator<<((ostream *)&std::cout,"No moves");
          std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
        }
        mm._0_4_ = 1;
        goto LAB_001180a5;
      }
      sort_moves(true);
      _i = std::vector<Move,_std::allocator<Move>_>::front(&moves);
      place_move(_i,false);
      if (!suppress) {
        print_board();
        poVar26 = operator<<((ostream *)&std::cout,_i);
        std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1c0,"pm");
      if (bVar7) {
        j._3_1_ = 0;
        std::__cxx11::string::string(local_208);
        std::__cxx11::string::string((string *)&__range4);
        piVar23 = std::operator>>((istream *)&local_1a0,local_208);
        bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
        if ((bVar9 & 1) == 0) {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_208,"-f");
          if (bVar7) {
            j._3_1_ = 1;
            piVar23 = std::operator>>((istream *)&local_1a0,local_208);
            bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
            if ((bVar9 & 1) != 0) {
              mm._0_4_ = 1;
              goto LAB_001160c0;
            }
          }
          plVar22 = (long *)std::istream::operator>>((istream *)&local_1a0,&p);
          bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
          if ((bVar9 & 1) == 0) {
            plVar22 = (long *)std::istream::operator>>((istream *)&local_1a0,&local_1e4);
            bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
            if ((bVar9 & 1) != 0) goto LAB_00115eb1;
          }
          else {
LAB_00115eb1:
            local_1e4 = (bsize + 1) / 2;
            p = local_1e4;
          }
          piVar23 = std::operator>>((istream *)&local_1a0,(string *)&__range4);
          bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
          if ((bVar9 & 1) != 0) {
            std::__cxx11::string::operator=((string *)&__range4,"a");
          }
          plVar22 = (long *)std::istream::operator>>((istream *)&local_1a0,&local_1e8);
          bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
          if ((bVar9 & 1) != 0) {
            local_1e8 = -1;
          }
          __end4._M_current = (char *)std::__cxx11::string::begin();
          c = (char *)std::__cxx11::string::end();
          while (bVar7 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&c), iVar6 = p, iVar5 = local_1e4, iVar12 = bsize,
                bVar7) {
            local_248 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&__end4);
            iVar12 = toupper((int)*local_248);
            *local_248 = (char)iVar12;
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end4);
          }
          pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)&__range4);
          Move::Move((Move *)&j_1,(string *)local_208,iVar6,iVar5,iVar12,*pcVar20 != 'd',0,local_1e8
                     ,0);
          place_move((Move *)&j_1,(bool)(j._3_1_ & 1));
          Move::~Move((Move *)&j_1);
          mm._0_4_ = 0;
        }
        else {
          mm._0_4_ = 1;
        }
LAB_001160c0:
        std::__cxx11::string::~string((string *)&__range4);
        std::__cxx11::string::~string(local_208);
      }
      else {
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1c0,"il");
        if (!bVar7) {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1c0,"rm");
          if (bVar7) {
            piVar23 = (istream *)std::istream::operator>>((istream *)&local_1a0,&local_380);
            plVar22 = (long *)std::istream::operator>>(piVar23,&local_384);
            bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
            if ((bVar9 & 1) != 0) {
              mm._0_4_ = 1;
              goto LAB_001180a5;
            }
            board[local_380][local_384] = '\0';
            points[local_380][local_384] = 0;
          }
          else {
            bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1c0,"pr");
            if (!bVar7) {
              bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1c0,"cl");
              if (bVar7) {
                std::__cxx11::string::string(local_4b0);
                piVar23 = std::operator>>((istream *)&local_1a0,local_4b0);
                bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
                bVar7 = (bVar9 & 1) != 0;
                if (!bVar7) {
                  pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_4b0);
                  iVar12 = toupper((int)*pcVar20);
                  puVar13 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_4b0);
                  *puVar13 = (char)iVar12;
                  pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_4b0);
                  calc_legal(*pcVar20);
                  pppbVar3 = *legal;
                  pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_4b0);
                  ppbVar4 = pppbVar3[(long)*pcVar20 + -0x41];
                  std::operator+((char *)local_4f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"legal[0][");
                  std::operator+(local_4d0,(char *)local_4f0);
                  print(ppbVar4,local_4d0);
                  std::__cxx11::string::~string((string *)local_4d0);
                  std::__cxx11::string::~string(local_4f0);
                  pppbVar3 = legal[1];
                  pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_4b0);
                  ppbVar4 = pppbVar3[(long)*pcVar20 + -0x41];
                  std::operator+((char *)local_530,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"legal[1][");
                  std::operator+(local_510,(char *)local_530);
                  print(ppbVar4,local_510);
                  std::__cxx11::string::~string((string *)local_510);
                  std::__cxx11::string::~string(local_530);
                }
                mm._0_4_ = (uint)bVar7;
                std::__cxx11::string::~string(local_4b0);
              }
              else {
                bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1c0,"swap");
                if (!bVar7) {
                  bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1c0,"ra");
                  if (bVar7) {
                    while (bVar7 = std::ios::operator_cast_to_bool
                                             ((ios *)((long)&local_1a0 + *(long *)(local_1a0 - 0x18)
                                                     )), bVar7) {
                      std::__cxx11::string::string(local_5a0);
                      std::operator>>((istream *)&local_1a0,local_5a0);
                      pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_5a0);
                      if (*pcVar20 == '+') {
                        pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_5a0);
                        iVar12 = isdigit((int)*pcVar20);
                        if (iVar12 == 0) {
                          __end13._M_current = (char *)std::__cxx11::string::begin();
                          c_3 = (char *)std::__cxx11::string::end();
                          while (bVar7 = __gnu_cxx::operator!=
                                                   (&__end13,(
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&c_3), bVar7) {
                            pcStack_5c8 = __gnu_cxx::
                                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator*(&__end13);
                            iVar12 = toupper((int)*pcStack_5c8);
                            lVar19 = (long)rack_size;
                            rack_size = rack_size + 1;
                            rack[lVar19] = (char)iVar12;
                            __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator++(&__end13);
                          }
                        }
                        else {
                          pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_5a0);
                          __range13._4_4_ = *pcVar20 + -0x30;
                          while( true ) {
                            local_d81 = 0;
                            if (__range13._4_4_ != 0) {
                              bVar7 = std::vector<char,_std::allocator<char>_>::empty(&bag);
                              local_d81 = bVar7 ^ 0xff;
                            }
                            if ((local_d81 & 1) == 0) break;
                            pvVar15 = std::vector<char,_std::allocator<char>_>::back(&bag);
                            lVar19 = (long)rack_size;
                            rack_size = rack_size + 1;
                            rack[lVar19] = *pvVar15;
                            std::vector<char,_std::allocator<char>_>::pop_back(&bag);
                            __range13._4_4_ = __range13._4_4_ + -1;
                          }
                        }
                      }
                      pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_5a0);
                      if (*pcVar20 == '-') {
                        for (pos_1._4_4_ = 1; uVar21 = (ulong)pos_1._4_4_,
                            uVar16 = std::__cxx11::string::size(), pcVar20 = rack, uVar21 < uVar16;
                            pos_1._4_4_ = pos_1._4_4_ + 1) {
                          pcVar17 = rack + rack_size;
                          pcVar18 = (char *)std::__cxx11::string::operator[]((ulong)local_5a0);
                          local_5dc = toupper((int)*pcVar18);
                          _i_6 = std::find<char*,int>(pcVar20,pcVar17,&local_5dc);
                          if (_i_6 != rack + rack_size) {
                            lVar19 = (long)rack_size;
                            rack_size = rack_size + -1;
                            std::move<char*,char*>(_i_6 + 1,rack + lVar19,_i_6);
                          }
                        }
                      }
                      std::__cxx11::string::~string(local_5a0);
                    }
                    if (suppress) {
                      mm._0_4_ = 1;
                      goto LAB_001180a5;
                    }
                    std::operator<<((ostream *)&std::cout,"rack: ");
                    for (local_5e0 = 0; local_5e0 < rack_size; local_5e0 = local_5e0 + 1) {
                      std::operator<<((ostream *)&std::cout,rack[local_5e0]);
                    }
                    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                  }
                  else {
                    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1c0,"lm");
                    if (bVar7) {
                      std::__cxx11::string::string((string *)&s);
                      iStack_604 = 999999;
                      local_608 = 0;
                      local_609 = 0;
                      while( true ) {
                        piVar23 = std::operator>>((istream *)&local_1a0,(string *)&s);
                        bVar7 = std::ios::operator_cast_to_bool
                                          ((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
                        if (!bVar7) break;
                        pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)&s);
                        if (*pcVar20 == '-') {
                          std::__cxx11::stringstream::stringstream(local_798);
                          uVar21 = std::__cxx11::string::length();
                          if (2 < uVar21) {
                            std::__cxx11::string::substr((ulong)&__range11,(ulong)&s);
                            std::operator<<(local_788,(string *)&__range11);
                            std::__cxx11::string::~string((string *)&__range11);
                          }
                          pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)&s);
                          cVar1 = *pcVar20;
                          if (cVar1 == 'h') {
                            local_609 = 1;
                          }
                          else if (cVar1 == 'n') {
                            plVar22 = (long *)std::istream::operator>>
                                                        ((istream *)local_798,
                                                         &stack0xfffffffffffff9fc);
                            bVar9 = std::ios::operator!((ios *)((long)plVar22 +
                                                               *(long *)(*plVar22 + -0x18)));
                            if ((bVar9 & 1) != 0) {
                              iStack_604 = 999999;
                            }
                          }
                          else if (cVar1 == 's') {
                            plVar22 = (long *)std::istream::operator>>
                                                        ((istream *)local_798,&local_608);
                            bVar9 = std::ios::operator!((ios *)((long)plVar22 +
                                                               *(long *)(*plVar22 + -0x18)));
                            if ((bVar9 & 1) != 0) {
                              local_608 = 0;
                            }
                          }
                          std::__cxx11::stringstream::~stringstream(local_798);
                        }
                      }
                      find_moves();
                      sort_moves((bool)(local_609 & 1));
                      __end11 = std::vector<Move,_std::allocator<Move>_>::begin(&moves);
                      m_1 = (Move *)std::vector<Move,_std::allocator<Move>_>::end(&moves);
                      while (((bVar7 = __gnu_cxx::operator!=
                                                 (&__end11,(
                                                  __normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>
                                                  *)&m_1), bVar7 &&
                              (m_00 = __gnu_cxx::
                                      __normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>
                                      ::operator*(&__end11), local_608 <= m_00->score)) &&
                             (iVar12 = iStack_604 + -1, bVar7 = iStack_604 != 0, iStack_604 = iVar12
                             , bVar7))) {
                        _Var11 = std::setw(0xb);
                        poVar26 = std::operator<<((ostream *)&std::cout,_Var11);
                        _Var8 = std::setfill<char>(' ');
                        poVar26 = std::operator<<(poVar26,_Var8._M_c);
                        poVar26 = operator<<(poVar26,m_00);
                        std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
                        __gnu_cxx::
                        __normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>::
                        operator++(&__end11);
                      }
                      std::__cxx11::string::~string((string *)&s);
                    }
                    else {
                      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1c0,"db");
                      if (!bVar7) {
                        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_1c0,"file");
                        if (bVar7) {
                          std::__cxx11::string::string(local_800);
                          piVar23 = std::operator>>((istream *)&local_1a0,local_800);
                          bVar9 = std::ios::operator!((ios *)(piVar23 +
                                                             *(long *)(*(long *)piVar23 + -0x18)));
                          if ((bVar9 & 1) == 0) {
                            _Var10 = std::operator|(_S_in,_S_out);
                            std::fstream::fstream(&local_a10,local_800,_Var10);
                            bVar9 = std::ios::operator!((ios *)((long)&local_a10 +
                                                               *(long *)(local_a10 - 0x18)));
                            if ((bVar9 & 1) != 0) {
                              poVar26 = std::operator<<((ostream *)&std::cout,local_800);
                              poVar26 = std::operator<<(poVar26," not found");
                              std::ostream::operator<<
                                        (poVar26,std::endl<char,std::char_traits<char>>);
                            }
                            while (bVar7 = std::ios::operator_cast_to_bool
                                                     ((ios *)((long)&local_a10 +
                                                             *(long *)(local_a10 - 0x18))), bVar7) {
                              std::__cxx11::string::string(local_a30);
                              std::getline<char,std::char_traits<char>,std::allocator<char>>
                                        ((istream *)&local_a10,local_a30);
                              do_command((string *)local_a30,suppress);
                              std::__cxx11::string::~string(local_a30);
                            }
                            std::fstream::~fstream(&local_a10);
                            mm._0_4_ = 0;
                          }
                          else {
                            mm._0_4_ = 1;
                          }
                          std::__cxx11::string::~string(local_800);
                        }
                        else {
                          bVar7 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1c0,"word");
                          if (!bVar7) {
                            bVar7 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1c0,"clear");
                            if (bVar7) {
                              clear();
                            }
                            else {
                              bVar7 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1c0,"ip");
                              if (bVar7) {
                                std::__cxx11::string::string(local_a90);
                                std::operator>>((istream *)&local_1a0,local_a90);
                                __range16._4_4_ = 0;
                                __end16._M_current = (char *)std::__cxx11::string::begin();
                                register0x00000000 = std::__cxx11::string::end();
                                while (bVar7 = __gnu_cxx::operator!=
                                                         (&__end16,(
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_ac8 + 0x18)), bVar7) {
                                  pcVar24 = __gnu_cxx::
                                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator*(&__end16);
                                  local_ac8[0x17] = *pcVar24;
                                  iVar12 = toupper((int)local_ac8[0x17]);
                                  __range16._4_4_ =
                                       ((__range16._4_4_ + iVar12 + -0x40) * 0x1b) % 0xdaf26b;
                                  __gnu_cxx::
                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator++(&__end16);
                                }
                                poVar26 = (ostream *)
                                          std::ostream::operator<<
                                                    (&std::cout,__range16._4_4_ / 0x1b);
                                poVar26 = std::operator<<(poVar26,":");
                                std::bitset<14348907UL>::operator[]
                                          ((bitset<14348907UL> *)local_ac8,0x128390);
                                bVar7 = std::bitset::reference::operator_cast_to_bool
                                                  ((reference *)local_ac8);
                                pvVar25 = (void *)std::ostream::operator<<(poVar26,bVar7);
                                std::ostream::operator<<
                                          (pvVar25,std::endl<char,std::char_traits<char>>);
                                std::bitset<14348907UL>::reference::~reference
                                          ((reference *)local_ac8);
                                std::__cxx11::string::~string(local_a90);
                              }
                              else {
                                poVar26 = std::operator<<((ostream *)&std::cout,
                                                          "Invalid command, try again.");
                                std::ostream::operator<<
                                          (poVar26,std::endl<char,std::char_traits<char>>);
                              }
                            }
                            goto LAB_0011809b;
                          }
                          std::__cxx11::string::string((string *)&__range14);
                          piVar23 = std::operator>>((istream *)&local_1a0,(string *)&__range14);
                          bVar9 = std::ios::operator!((ios *)(piVar23 +
                                                             *(long *)(*(long *)piVar23 + -0x18)));
                          if ((bVar9 & 1) == 0) {
                            __end14._M_current = (char *)std::__cxx11::string::begin();
                            c_4 = (char *)std::__cxx11::string::end();
                            while (bVar7 = __gnu_cxx::operator!=
                                                     (&__end14,(
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&c_4), bVar7) {
                              pcVar24 = __gnu_cxx::
                                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator*(&__end14);
                              iVar12 = toupper((int)*pcVar24);
                              *pcVar24 = (char)iVar12;
                              __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator++(&__end14);
                            }
                            bVar7 = is_word((string *)&__range14);
                            pvVar25 = (void *)std::ostream::operator<<(&std::cout,bVar7);
                            std::ostream::operator<<(pvVar25,std::endl<char,std::char_traits<char>>)
                            ;
                            mm._0_4_ = 0;
                          }
                          else {
                            mm._0_4_ = 1;
                          }
                          std::__cxx11::string::~string((string *)&__range14);
                        }
                        goto joined_r0x00116e6e;
                      }
                      std::istream::operator>>((istream *)&local_1a0,&debug);
                    }
                  }
                  goto LAB_0011809b;
                }
                std::__cxx11::string::string((string *)&__range9);
                piVar23 = std::operator>>((istream *)&local_1a0,(string *)&__range9);
                bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
                if ((bVar9 & 1) == 0) {
                  __end9._M_current = (char *)std::__cxx11::string::begin();
                  c_2 = (char *)std::__cxx11::string::end();
                  while (bVar7 = __gnu_cxx::operator!=
                                           (&__end9,(
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&c_2), bVar7) {
                    pos = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&__end9);
                    pcVar20 = rack;
                    pcVar17 = rack + rack_size;
                    local_57c = toupper((int)*pos);
                    pcVar20 = std::find<char*,int>(pcVar20,pcVar17,&local_57c);
                    local_578 = pcVar20;
                    if (pcVar20 != rack + rack_size) {
                      iVar12 = rand();
                      sVar14 = std::vector<char,_std::allocator<char>_>::size(&bag);
                      pvVar15 = std::vector<char,_std::allocator<char>_>::operator[]
                                          (&bag,(ulong)(long)iVar12 % sVar14);
                      std::swap<char>(pcVar20,pvVar15);
                    }
                    __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&__end9);
                  }
                  mm._0_4_ = 0;
                }
                else {
                  mm._0_4_ = 1;
                }
                std::__cxx11::string::~string((string *)&__range9);
              }
              goto joined_r0x00116e6e;
            }
            std::__cxx11::string::string((string *)&__range7);
            std::operator>>((istream *)&local_1a0,(string *)&__range7);
            __end7._M_current = (char *)std::__cxx11::string::begin();
            _Stack_3c0._M_current = (char *)std::__cxx11::string::end();
            while (bVar7 = __gnu_cxx::operator!=(&__end7,&stack0xfffffffffffffc40), bVar7) {
              pcVar24 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&__end7);
              arr_00 = points;
              arr = letter_mult;
              ppiVar2 = word_mult;
              local_3c1 = *pcVar24;
              switch(local_3c1) {
              case 'a':
                ppiVar2 = *adj;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3e8,"adj[0]:",&local_3e9);
                print(ppiVar2,(string *)local_3e8,3);
                std::__cxx11::string::~string(local_3e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
                ppiVar2 = adj[1];
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&i_3,"adj[1]:",&local_411);
                print(ppiVar2,(string *)&i_3,3);
                std::__cxx11::string::~string((string *)&i_3);
                std::allocator<char>::~allocator((allocator<char> *)&local_411);
                break;
              case 'b':
                poVar26 = std::operator<<((ostream *)&std::cout,"board:");
                std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
                print_board();
                break;
              default:
                poVar26 = std::operator<<((ostream *)&std::cout,"Invalid print command: ");
                poVar26 = std::operator<<(poVar26,local_3c1);
                std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
                break;
              case 'l':
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_438,"letter multipliers:",&local_439);
                print(arr,(string *)local_438,1);
                std::__cxx11::string::~string(local_438);
                std::allocator<char>::~allocator((allocator<char> *)&local_439);
                break;
              case 'p':
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_488,"tile values:",&local_489);
                print(arr_00,(string *)local_488,3);
                std::__cxx11::string::~string(local_488);
                std::allocator<char>::~allocator((allocator<char> *)&local_489);
                break;
              case 'r':
                std::operator<<((ostream *)&std::cout,"rack: ");
                for (local_418 = 0; local_418 < rack_size; local_418 = local_418 + 1) {
                  std::operator<<((ostream *)&std::cout,rack[local_418]);
                }
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                break;
              case 'w':
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_460,"word multipliers:",&local_461);
                print(ppiVar2,(string *)local_460,1);
                std::__cxx11::string::~string(local_460);
                std::allocator<char>::~allocator((allocator<char> *)&local_461);
              }
              __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&__end7);
            }
            std::__cxx11::string::~string((string *)&__range7);
          }
          goto LAB_0011809b;
        }
        std::__cxx11::string::string(local_2d8);
        std::__cxx11::string::string((string *)&__range5);
        piVar23 = std::operator>>((istream *)&local_1a0,local_2d8);
        bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
        if ((bVar9 & 1) == 0) {
          plVar22 = (long *)std::istream::operator>>((istream *)&local_1a0,&p_1);
          bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
          if ((bVar9 & 1) == 0) {
            plVar22 = (long *)std::istream::operator>>((istream *)&local_1a0,&local_2b0);
            bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
            if ((bVar9 & 1) != 0) goto LAB_0011622e;
          }
          else {
LAB_0011622e:
            local_2b0 = (bsize + 1) / 2;
            p_1 = local_2b0;
          }
          piVar23 = std::operator>>((istream *)&local_1a0,(string *)&__range5);
          bVar9 = std::ios::operator!((ios *)(piVar23 + *(long *)(*(long *)piVar23 + -0x18)));
          if ((bVar9 & 1) != 0) {
            std::__cxx11::string::operator=((string *)&__range5,"a");
          }
          plVar22 = (long *)std::istream::operator>>((istream *)&local_1a0,&local_2b4);
          bVar9 = std::ios::operator!((ios *)((long)plVar22 + *(long *)(*plVar22 + -0x18)));
          if ((bVar9 & 1) != 0) {
            local_2b4 = -1;
          }
          __end5._M_current = (char *)std::__cxx11::string::begin();
          c_1 = (char *)std::__cxx11::string::end();
          while (bVar7 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&c_1), iVar6 = p_1, iVar5 = local_2b0, iVar12 = bsize
                , bVar7) {
            m._88_8_ = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end5);
            iVar12 = toupper((int)*(char *)m._88_8_);
            *(char *)m._88_8_ = (char)iVar12;
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end5);
          }
          pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)&__range5);
          Move::Move((Move *)&i_2,(string *)local_2d8,iVar6,iVar5,iVar12,*pcVar20 != 'd',0,local_2b4
                     ,0);
          j_2._3_1_ = is_legal((Move *)&i_2);
          poVar26 = operator<<((ostream *)&std::cout,(Move *)&i_2);
          poVar26 = std::operator<<(poVar26," legal: ");
          pvVar25 = (void *)std::ostream::operator<<(poVar26,(bool)(j_2._3_1_ & 1));
          std::ostream::operator<<(pvVar25,std::endl<char,std::char_traits<char>>);
          Move::~Move((Move *)&i_2);
          mm._0_4_ = 0;
        }
        else {
          mm._0_4_ = 1;
        }
        std::__cxx11::string::~string((string *)&__range5);
        std::__cxx11::string::~string(local_2d8);
      }
joined_r0x00116e6e:
      if ((uint)mm != 0) goto LAB_001180a5;
    }
  }
LAB_0011809b:
  mm._0_4_ = 0;
LAB_001180a5:
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  return;
}

Assistant:

void do_command(string &cmd_string, bool suppress) {
    stringstream line(cmd_string);
    string command;
    line >> command;
    if (command == "game") {
        game_loop();
    } else if (command == "pb") { // play best move (according to bot)
        find_moves();
        if (moves.empty()) {
            if (!suppress) cout << "No moves" << endl;
            return;
        }
        sort_moves();
        Move &mm = moves.front();
        place_move(mm);
        if (!suppress) {
            print_board();
            cout << mm << endl;
        }
        //do_command("ra -"+mm.word,suppress);
    } else if (command == "pm") { // Play move
        bool override = false;
        int i, j, p;
        string ss, acr;
        if (!(line >> ss)) return;
        if (ss == "-f") {
            override = true;
            if (!(line >> ss)) return;
        }
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        place_move(Move(ss, i, j, bsize, acr[0] != 'd', 0, p), override);
    } else if (command == "il") { // List legal moves
        int i, j, p;
        string ss, acr;
        if (!(line >> ss)) return;
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        Move m(ss, i, j, bsize, acr[0] != 'd', 0, p);
        bool leg = is_legal(m);
        cout << m << " legal: " << leg << endl;
    } else if (command == "rm") { // remove a tile from the board
        int i, j;
        if (!(line >> i >> j)) return;
        board[i][j] = 0;
        points[i][j] = 0;
    } else if (command == "pr") {
        string ss;
        line >> ss;
        for (char cc:ss) {
            switch (cc) {
                case 'b': // print the board
                    cout << "board:" << endl;
                    print_board();
                    break;
                case 'a': // prints the scores of adjacent words
                    print(adj[0], "adj[0]:", 3);
                    print(adj[1], "adj[1]:", 3);
                    break;
                case 'r': // print my rack
                    cout << "rack: ";
                    for (int i = 0; i < rack_size; i++) cout << rack[i];
                    cout << endl;
                    break;
                case 'l': // print letter bonus squares
                    print(letter_mult, "letter multipliers:");
                    break;
                case 'w': // print word bonus squares
                    print(word_mult, "word multipliers:");
                    break;
                case 'p': // print tile values
                    print(points, "tile values:", 3);
                    break;
                default:
                    cout << "Invalid print command: " << cc << endl;
                    break;
            }
        }
    } else if (command == "cl") {
        string ss;
        if (!(line >> ss)) return;
        ss[0] = toupper(ss[0]);
        calc_legal(ss[0]);
        print(legal[0][ss[0] - 'A'], "legal[0][" + ss + "]");
        print(legal[1][ss[0] - 'A'], "legal[1][" + ss + "]");
    } else if (command == "swap") {
        string ss;
        if (!(line >> ss)) return;
        for (char &c:ss) {
            char *pos = find(rack, rack + rack_size, toupper(c));
            if (pos != rack + rack_size) {
                std::swap(rack[pos - rack], bag[rand() % bag.size()]);
            }
        }
    } else if (command == "ra") {
        while (line) {
            string ss;
            line >> ss;
            if (ss[0] == '+') {
                if (isdigit(ss[1]))
                    for (int i = ss[1] - '0'; i-- && !bag.empty();) {
                        rack[rack_size++] = bag.back();
                        bag.pop_back();
                    }
                else
                    for (char &c:ss)
                        rack[rack_size++] = toupper(c);
            }
            if (ss[0] == '-') {
                for (int i = 1; i < ss.size(); i++) {
                    char *pos = find(rack, rack + rack_size, toupper(ss[i]));
                    if (pos != rack + rack_size)
                        std::move(pos + 1, rack + rack_size--, pos);
                }
            }
        }
        if (suppress) return;
        cout << "rack: ";
        for (int i = 0; i < rack_size; i++) cout << rack[i];
        cout << endl;
    } else if (command == "lm") {
        string st;
        int n = 999999, s = 0;
        bool use_heuristics = false;
        while (line >> st) {
            if (st[0] != '-') continue;
            stringstream ss;
            if (st.length() >= 3) ss << st.substr(3);
            switch (st[1]) {
                case 'n':
                    if (!(ss >> n)) n = 999999;
                    break;
                case 's':
                    if (!(ss >> s)) s = 0;
                    break;
                case 'h':
                    use_heuristics = true;
                    break;
            }
        }
        find_moves();
        sort_moves(use_heuristics);
        for (Move &m:moves) {
            if (m.score < s || n-- == 0) break;
            cout << setw(11) << setfill(' ') << m << endl;
        }
    } else if (command == "db") {
        line >> debug;
    } else if (command == "file") {
        string name;
        if (!(line >> name)) return;
        fstream fs{name};
        if (!fs) cout << name << " not found" << endl;
        while (fs) {
            string cm;
            getline(fs, cm);
            do_command(cm, suppress);
        }
    } else if (command == "word") {
        string w;
        if (!(line >> w)) return;
        for (char &c:w) c = toupper(int(c));
        cout << is_word(w) << endl;
    } else if (command == "clear") {
        clear();
    } else if (command == "ip") {
        string s;
        line >> s;
        int r_hash = 0;
        for (char c:s) {
            r_hash = ((r_hash + toupper(c) - 'A' + 1) * 27) % MOD;
        }
        cout << r_hash / 27 << ":" << chains[r_hash / 27] << endl;
    } else {
        cout << "Invalid command, try again." << endl;
    }
}